

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int syncJournal(Pager *pPager,int newHdr)

{
  PCache *pPVar1;
  sqlite3_io_methods *psVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  PgHdr *pPVar6;
  uint uVar7;
  sqlite3_int64 sVar8;
  long in_FS_OFFSET;
  bool bVar9;
  u8 zHeader [12];
  u8 aMagic [8];
  undefined8 local_50;
  uint local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = sqlite3PagerExclusiveLock(pPager);
  if (iVar3 != 0) goto LAB_0012b81f;
  if (pPager->noSync == '\0') {
    if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) || (pPager->journalMode == '\x04')) {
      pPager->journalHdr = pPager->journalOff;
    }
    else {
      psVar2 = pPager->fd->pMethods;
      if (psVar2 == (sqlite3_io_methods *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (*psVar2->xDeviceCharacteristics)(pPager->fd);
      }
      if ((uVar4 >> 9 & 1) == 0) {
        local_50 = 0xd763a120f905d5d9;
        uVar7 = pPager->nRec;
        local_48 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        if (pPager->journalOff == 0) {
          sVar8 = 0;
        }
        else {
          sVar8 = ((pPager->journalOff + -1) / (long)(ulong)pPager->sectorSize + 1) *
                  (ulong)pPager->sectorSize;
        }
        iVar3 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&local_40,8,sVar8);
        if ((iVar3 == 0) && (iVar3 = 0, local_40 == -0x289c5edf06fa2a27)) {
          iVar3 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,"",1,sVar8);
        }
        if ((iVar3 == 0x20a) || (iVar3 == 0)) {
          if (((uVar4 >> 10 & 1) == 0) && (pPager->fullSync != '\0')) {
            if (pPager->syncFlags == 0) {
              iVar3 = 0;
            }
            else {
              iVar3 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,(uint)pPager->syncFlags);
            }
            if (iVar3 != 0) goto LAB_0012b923;
          }
          iVar3 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_50,0xc,pPager->journalHdr);
          bVar9 = iVar3 == 0;
        }
        else {
LAB_0012b923:
          bVar9 = false;
        }
        if (bVar9) goto LAB_0012b94b;
        bVar9 = false;
      }
      else {
LAB_0012b94b:
        if ((uVar4 >> 10 & 1) == 0) {
          uVar7 = (uint)(pPager->syncFlags == 3) << 4 | (uint)pPager->syncFlags;
          if (uVar7 == 0) {
            iVar5 = 0;
          }
          else {
            iVar5 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,uVar7);
          }
          if (iVar5 == 0) goto LAB_0012b97c;
LAB_0012b9a4:
          iVar3 = iVar5;
          bVar9 = false;
        }
        else {
LAB_0012b97c:
          pPager->journalHdr = pPager->journalOff;
          if ((newHdr != 0) && ((uVar4 & 0x200) == 0)) {
            pPager->nRec = 0;
            iVar5 = writeJournalHdr(pPager);
            if (iVar5 != 0) goto LAB_0012b9a4;
          }
          bVar9 = true;
        }
      }
      if (!bVar9) goto LAB_0012b81f;
    }
  }
  pPVar1 = pPager->pPCache;
  for (pPVar6 = pPVar1->pDirty; pPVar6 != (PgHdr *)0x0; pPVar6 = pPVar6->pDirtyNext) {
    *(byte *)&pPVar6->flags = (byte)pPVar6->flags & 0xf7;
  }
  pPVar1->pSynced = pPVar1->pDirtyTail;
  pPager->eState = '\x04';
  iVar3 = 0;
LAB_0012b81f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int syncJournal(Pager *pPager, int newHdr){
  int rc;                         /* Return code */

  assert( pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );
  assert( !pagerUseWal(pPager) );

  rc = sqlite3PagerExclusiveLock(pPager);
  if( rc!=SQLITE_OK ) return rc;

  if( !pPager->noSync ){
    assert( !pPager->tempFile );
    if( isOpen(pPager->jfd) && pPager->journalMode!=PAGER_JOURNALMODE_MEMORY ){
      const int iDc = sqlite3OsDeviceCharacteristics(pPager->fd);
      assert( isOpen(pPager->jfd) );

      if( 0==(iDc&SQLITE_IOCAP_SAFE_APPEND) ){
        /* This block deals with an obscure problem. If the last connection
        ** that wrote to this database was operating in persistent-journal
        ** mode, then the journal file may at this point actually be larger
        ** than Pager.journalOff bytes. If the next thing in the journal
        ** file happens to be a journal-header (written as part of the
        ** previous connection's transaction), and a crash or power-failure
        ** occurs after nRec is updated but before this connection writes
        ** anything else to the journal file (or commits/rolls back its
        ** transaction), then SQLite may become confused when doing the
        ** hot-journal rollback following recovery. It may roll back all
        ** of this connections data, then proceed to rolling back the old,
        ** out-of-date data that follows it. Database corruption.
        **
        ** To work around this, if the journal file does appear to contain
        ** a valid header following Pager.journalOff, then write a 0x00
        ** byte to the start of it to prevent it from being recognized.
        **
        ** Variable iNextHdrOffset is set to the offset at which this
        ** problematic header will occur, if it exists. aMagic is used
        ** as a temporary buffer to inspect the first couple of bytes of
        ** the potential journal header.
        */
        i64 iNextHdrOffset;
        u8 aMagic[8];
        u8 zHeader[sizeof(aJournalMagic)+4];

        memcpy(zHeader, aJournalMagic, sizeof(aJournalMagic));
        put32bits(&zHeader[sizeof(aJournalMagic)], pPager->nRec);

        iNextHdrOffset = journalHdrOffset(pPager);
        rc = sqlite3OsRead(pPager->jfd, aMagic, 8, iNextHdrOffset);
        if( rc==SQLITE_OK && 0==memcmp(aMagic, aJournalMagic, 8) ){
          static const u8 zerobyte = 0;
          rc = sqlite3OsWrite(pPager->jfd, &zerobyte, 1, iNextHdrOffset);
        }
        if( rc!=SQLITE_OK && rc!=SQLITE_IOERR_SHORT_READ ){
          return rc;
        }

        /* Write the nRec value into the journal file header. If in
        ** full-synchronous mode, sync the journal first. This ensures that
        ** all data has really hit the disk before nRec is updated to mark
        ** it as a candidate for rollback.
        **
        ** This is not required if the persistent media supports the
        ** SAFE_APPEND property. Because in this case it is not possible
        ** for garbage data to be appended to the file, the nRec field
        ** is populated with 0xFFFFFFFF when the journal header is written
        ** and never needs to be updated.
        */
        if( pPager->fullSync && 0==(iDc&SQLITE_IOCAP_SEQUENTIAL) ){
          PAGERTRACE(("SYNC journal of %d\n", PAGERID(pPager)));
          IOTRACE(("JSYNC %p\n", pPager))
          rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags);
          if( rc!=SQLITE_OK ) return rc;
        }
        IOTRACE(("JHDR %p %lld\n", pPager, pPager->journalHdr));
        rc = sqlite3OsWrite(
            pPager->jfd, zHeader, sizeof(zHeader), pPager->journalHdr
        );
        if( rc!=SQLITE_OK ) return rc;
      }
      if( 0==(iDc&SQLITE_IOCAP_SEQUENTIAL) ){
        PAGERTRACE(("SYNC journal of %d\n", PAGERID(pPager)));
        IOTRACE(("JSYNC %p\n", pPager))
        rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags|
          (pPager->syncFlags==SQLITE_SYNC_FULL?SQLITE_SYNC_DATAONLY:0)
        );
        if( rc!=SQLITE_OK ) return rc;
      }

      pPager->journalHdr = pPager->journalOff;
      if( newHdr && 0==(iDc&SQLITE_IOCAP_SAFE_APPEND) ){
        pPager->nRec = 0;
        rc = writeJournalHdr(pPager);
        if( rc!=SQLITE_OK ) return rc;
      }
    }else{
      pPager->journalHdr = pPager->journalOff;
    }
  }

  /* Unless the pager is in noSync mode, the journal file was just
  ** successfully synced. Either way, clear the PGHDR_NEED_SYNC flag on
  ** all pages.
  */
  sqlite3PcacheClearSyncFlags(pPager->pPCache);
  pPager->eState = PAGER_WRITER_DBMOD;
  assert( assert_pager_state(pPager) );
  return SQLITE_OK;
}